

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darRefact.c
# Opt level: O0

int Dar_ManRefactorTryCuts(Ref_Man_t *p,Aig_Obj_t *pObj,int nNodesSaved,int Required)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Vec_Ptr_t *p_00;
  uint *pIn;
  Kit_Graph_t *pKVar5;
  uint *pTruth;
  int nNodesAdded;
  int GainCur;
  int RetValue;
  int k;
  Kit_Graph_t *pGraphCur;
  Vec_Ptr_t *vCut;
  int Required_local;
  int nNodesSaved_local;
  Aig_Obj_t *pObj_local;
  Ref_Man_t *p_local;
  
  p->GainBest = -1;
  p->pGraphBest = (Kit_Graph_t *)0x0;
  GainCur = 0;
  do {
    iVar2 = Vec_VecSize(p->vCuts);
    if (iVar2 <= GainCur) {
      return p->GainBest;
    }
    p_00 = Vec_VecEntry(p->vCuts,GainCur);
    iVar2 = Vec_PtrSize(p_00);
    if (iVar2 != 0) {
      p->nCutsTried = p->nCutsTried + 1;
      Aig_ObjCollectCut(pObj,p_00,p->vCutNodes);
      pIn = Aig_ManCutTruth(pObj,p_00,p->vCutNodes,p->vTruthElem,p->vTruthStore);
      iVar2 = Vec_PtrSize(p_00);
      iVar2 = Kit_TruthIsConst0(pIn,iVar2);
      if (iVar2 != 0) {
        iVar2 = Aig_NodeMffcSupp(p->pAig,pObj,0,(Vec_Ptr_t *)0x0);
        p->GainBest = iVar2;
        pKVar5 = Kit_GraphCreateConst0();
        p->pGraphBest = pKVar5;
        Vec_PtrCopy(p->vLeavesBest,p_00);
        return p->GainBest;
      }
      iVar2 = Vec_PtrSize(p_00);
      iVar2 = Kit_TruthIsConst1(pIn,iVar2);
      if (iVar2 != 0) {
        iVar2 = Aig_NodeMffcSupp(p->pAig,pObj,0,(Vec_Ptr_t *)0x0);
        p->GainBest = iVar2;
        pKVar5 = Kit_GraphCreateConst1();
        p->pGraphBest = pKVar5;
        Vec_PtrCopy(p->vLeavesBest,p_00);
        return p->GainBest;
      }
      iVar2 = Vec_PtrSize(p_00);
      iVar2 = Kit_TruthIsop(pIn,iVar2,p->vMemory,0);
      if (-1 < iVar2) {
        pVVar1 = p->vMemory;
        iVar2 = Vec_PtrSize(p_00);
        pKVar5 = Kit_SopFactor(pVVar1,0,iVar2,p->vMemory);
        iVar2 = Dar_RefactTryGraph(p->pAig,pObj,p_00,pKVar5,
                                   nNodesSaved - (uint)((p->pPars->fUseZeros != 0 ^ 0xffU) & 1),
                                   Required);
        if (iVar2 < 0) {
          Kit_GraphFree(pKVar5);
        }
        else {
          iVar2 = nNodesSaved - iVar2;
          if (iVar2 <= p->GainBest) {
            if (p->GainBest != iVar2) {
LAB_005d92aa:
              Kit_GraphFree(pKVar5);
              goto LAB_005d92c0;
            }
            iVar3 = Kit_GraphIsConst(pKVar5);
            if (iVar3 == 0) {
              iVar3 = Kit_GraphRootLevel(pKVar5);
              iVar4 = Kit_GraphRootLevel(p->pGraphBest);
              if (iVar4 <= iVar3) goto LAB_005d92aa;
            }
          }
          p->GainBest = iVar2;
          if (p->pGraphBest != (Kit_Graph_t *)0x0) {
            Kit_GraphFree(p->pGraphBest);
          }
          p->pGraphBest = pKVar5;
          Vec_PtrCopy(p->vLeavesBest,p_00);
        }
      }
LAB_005d92c0:
      iVar2 = Vec_PtrSize(p_00);
      Kit_TruthNot(pIn,pIn,iVar2);
      iVar2 = Vec_PtrSize(p_00);
      iVar2 = Kit_TruthIsop(pIn,iVar2,p->vMemory,0);
      if (-1 < iVar2) {
        pVVar1 = p->vMemory;
        iVar2 = Vec_PtrSize(p_00);
        pKVar5 = Kit_SopFactor(pVVar1,1,iVar2,p->vMemory);
        iVar2 = Dar_RefactTryGraph(p->pAig,pObj,p_00,pKVar5,
                                   nNodesSaved - (uint)((p->pPars->fUseZeros != 0 ^ 0xffU) & 1),
                                   Required);
        if (iVar2 < 0) {
          Kit_GraphFree(pKVar5);
        }
        else {
          iVar2 = nNodesSaved - iVar2;
          if (iVar2 <= p->GainBest) {
            if (p->GainBest != iVar2) {
LAB_005d943c:
              Kit_GraphFree(pKVar5);
              goto LAB_005d9454;
            }
            iVar3 = Kit_GraphIsConst(pKVar5);
            if (iVar3 == 0) {
              iVar3 = Kit_GraphRootLevel(pKVar5);
              iVar4 = Kit_GraphRootLevel(p->pGraphBest);
              if (iVar4 <= iVar3) goto LAB_005d943c;
            }
          }
          p->GainBest = iVar2;
          if (p->pGraphBest != (Kit_Graph_t *)0x0) {
            Kit_GraphFree(p->pGraphBest);
          }
          p->pGraphBest = pKVar5;
          Vec_PtrCopy(p->vLeavesBest,p_00);
        }
      }
    }
LAB_005d9454:
    GainCur = GainCur + 1;
  } while( true );
}

Assistant:

int Dar_ManRefactorTryCuts( Ref_Man_t * p, Aig_Obj_t * pObj, int nNodesSaved, int Required )
{
    Vec_Ptr_t * vCut;
    Kit_Graph_t * pGraphCur;
    int k, RetValue, GainCur, nNodesAdded;
    unsigned * pTruth;

    p->GainBest = -1;
    p->pGraphBest = NULL;
    Vec_VecForEachLevel( p->vCuts, vCut, k )
    {
        if ( Vec_PtrSize(vCut) == 0 )
            continue;
//        if ( Vec_PtrSize(vCut) != 0 && Vec_PtrSize(Vec_VecEntry(p->vCuts, k+1)) != 0 )
//            continue;

        p->nCutsTried++;
        // get the cut nodes
        Aig_ObjCollectCut( pObj, vCut, p->vCutNodes );
        // get the truth table
        pTruth = Aig_ManCutTruth( pObj, vCut, p->vCutNodes, p->vTruthElem, p->vTruthStore );
        if ( Kit_TruthIsConst0(pTruth, Vec_PtrSize(vCut)) )
        {
            p->GainBest = Aig_NodeMffcSupp( p->pAig, pObj, 0, NULL );
            p->pGraphBest = Kit_GraphCreateConst0();
            Vec_PtrCopy( p->vLeavesBest, vCut );
            return p->GainBest;
        }
        if ( Kit_TruthIsConst1(pTruth, Vec_PtrSize(vCut)) )
        {
            p->GainBest = Aig_NodeMffcSupp( p->pAig, pObj, 0, NULL );
            p->pGraphBest = Kit_GraphCreateConst1();
            Vec_PtrCopy( p->vLeavesBest, vCut );
            return p->GainBest;
        }

        // try the positive phase
        RetValue = Kit_TruthIsop( pTruth, Vec_PtrSize(vCut), p->vMemory, 0 );
        if ( RetValue > -1 )
        {
            pGraphCur = Kit_SopFactor( p->vMemory, 0, Vec_PtrSize(vCut), p->vMemory );
/*
{
    int RetValue;
    RetValue = Bdc_ManDecompose( p->pManDec, pTruth, NULL, Vec_PtrSize(vCut), NULL, 1000 );
    printf( "Graph = %d. Bidec = %d.\n", Kit_GraphNodeNum(pGraphCur), RetValue );
}
*/
            nNodesAdded = Dar_RefactTryGraph( p->pAig, pObj, vCut, pGraphCur, nNodesSaved - !p->pPars->fUseZeros, Required );
            if ( nNodesAdded > -1 )
            {
                GainCur = nNodesSaved - nNodesAdded;
                if ( p->GainBest < GainCur || (p->GainBest == GainCur && 
                    (Kit_GraphIsConst(pGraphCur) || Kit_GraphRootLevel(pGraphCur) < Kit_GraphRootLevel(p->pGraphBest))) )
                {
                    p->GainBest = GainCur;
                    if ( p->pGraphBest )
                        Kit_GraphFree( p->pGraphBest );
                    p->pGraphBest = pGraphCur;
                    Vec_PtrCopy( p->vLeavesBest, vCut );
                }
                else
                    Kit_GraphFree( pGraphCur );
            }
            else
                Kit_GraphFree( pGraphCur );
        }
        // try negative phase
        Kit_TruthNot( pTruth, pTruth, Vec_PtrSize(vCut) );
        RetValue = Kit_TruthIsop( pTruth, Vec_PtrSize(vCut), p->vMemory, 0 );
//        Kit_TruthNot( pTruth, pTruth, Vec_PtrSize(vCut) );
        if ( RetValue > -1 )
        {
            pGraphCur = Kit_SopFactor( p->vMemory, 1, Vec_PtrSize(vCut), p->vMemory );
/*
{
    int RetValue;
    RetValue = Bdc_ManDecompose( p->pManDec, pTruth, NULL, Vec_PtrSize(vCut), NULL, 1000 );
    printf( "Graph = %d. Bidec = %d.\n", Kit_GraphNodeNum(pGraphCur), RetValue );
}
*/
            nNodesAdded = Dar_RefactTryGraph( p->pAig, pObj, vCut, pGraphCur, nNodesSaved - !p->pPars->fUseZeros, Required );
            if ( nNodesAdded > -1 )
            {
                GainCur = nNodesSaved - nNodesAdded;
                if ( p->GainBest < GainCur || (p->GainBest == GainCur && 
                    (Kit_GraphIsConst(pGraphCur) || Kit_GraphRootLevel(pGraphCur) < Kit_GraphRootLevel(p->pGraphBest))) )
                {
                    p->GainBest = GainCur;
                    if ( p->pGraphBest )
                        Kit_GraphFree( p->pGraphBest );
                    p->pGraphBest = pGraphCur;
                    Vec_PtrCopy( p->vLeavesBest, vCut );
                }
                else
                    Kit_GraphFree( pGraphCur );
            }
            else
                Kit_GraphFree( pGraphCur );
        }
    }

    return p->GainBest;
}